

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::generateRandomConfig
          (IterationConfig *__return_storage_ptr__,BBoxRenderCase *this,int seed,
          IVec2 *renderTargetSize)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  Vector<float,_4> local_64;
  Vector<float,_4> local_54;
  undefined1 local_38 [8];
  Random rnd;
  IVec2 *renderTargetSize_local;
  int seed_local;
  BBoxRenderCase *this_local;
  IterationConfig *config;
  
  rnd.m_rnd._8_8_ = renderTargetSize;
  de::Random::Random((Random *)local_38,seed);
  IterationConfig::IterationConfig(__return_storage_ptr__);
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)rnd.m_rnd._8_8_);
  iVar2 = de::min<int>(iVar2,0x200);
  iVar2 = de::Random::getInt((Random *)local_38,0x100,iVar2);
  piVar3 = tcu::Vector<int,_2>::x(&__return_storage_ptr__->viewportSize);
  *piVar3 = iVar2;
  iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)rnd.m_rnd._8_8_);
  iVar2 = de::min<int>(iVar2,0x200);
  iVar2 = de::Random::getInt((Random *)local_38,0x100,iVar2);
  piVar3 = tcu::Vector<int,_2>::y(&__return_storage_ptr__->viewportSize);
  *piVar3 = iVar2;
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)rnd.m_rnd._8_8_);
  piVar3 = tcu::Vector<int,_2>::x(&__return_storage_ptr__->viewportSize);
  iVar2 = de::Random::getInt((Random *)local_38,0,iVar2 - *piVar3);
  piVar3 = tcu::Vector<int,_2>::x(&__return_storage_ptr__->viewportPos);
  *piVar3 = iVar2;
  iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)rnd.m_rnd._8_8_);
  piVar3 = tcu::Vector<int,_2>::y(&__return_storage_ptr__->viewportSize);
  iVar2 = de::Random::getInt((Random *)local_38,0,iVar2 - *piVar3);
  piVar3 = tcu::Vector<int,_2>::y(&__return_storage_ptr__->viewportPos);
  *piVar3 = iVar2;
  fVar5 = de::Random::getFloat((Random *)local_38,0.4,1.4);
  pfVar4 = tcu::Vector<float,_2>::x(&__return_storage_ptr__->patternSize);
  *pfVar4 = fVar5;
  fVar5 = de::Random::getFloat((Random *)local_38,0.4,1.4);
  pfVar4 = tcu::Vector<float,_2>::y(&__return_storage_ptr__->patternSize);
  *pfVar4 = fVar5;
  pfVar4 = tcu::Vector<float,_2>::x(&__return_storage_ptr__->patternSize);
  fVar5 = de::Random::getFloat((Random *)local_38,-1.0,1.0 - *pfVar4);
  pfVar4 = tcu::Vector<float,_2>::x(&__return_storage_ptr__->patternPos);
  *pfVar4 = fVar5;
  pfVar4 = tcu::Vector<float,_2>::y(&__return_storage_ptr__->patternSize);
  fVar5 = de::Random::getFloat((Random *)local_38,-1.0,1.0 - *pfVar4);
  pfVar4 = tcu::Vector<float,_2>::y(&__return_storage_ptr__->patternPos);
  *pfVar4 = fVar5;
  pfVar4 = tcu::Vector<float,_2>::x(&__return_storage_ptr__->patternPos);
  fVar5 = *pfVar4;
  pfVar4 = tcu::Vector<float,_2>::y(&__return_storage_ptr__->patternPos);
  tcu::Vector<float,_4>::Vector(&local_54,fVar5,*pfVar4,0.0,1.0);
  *(undefined8 *)(__return_storage_ptr__->bbox).min.m_data = local_54.m_data._0_8_;
  *(undefined8 *)((__return_storage_ptr__->bbox).min.m_data + 2) = local_54.m_data._8_8_;
  pfVar4 = tcu::Vector<float,_2>::x(&__return_storage_ptr__->patternPos);
  fVar5 = *pfVar4;
  pfVar4 = tcu::Vector<float,_2>::x(&__return_storage_ptr__->patternSize);
  fVar6 = *pfVar4;
  pfVar4 = tcu::Vector<float,_2>::y(&__return_storage_ptr__->patternPos);
  fVar1 = *pfVar4;
  pfVar4 = tcu::Vector<float,_2>::y(&__return_storage_ptr__->patternSize);
  tcu::Vector<float,_4>::Vector(&local_64,fVar5 + fVar6,fVar1 + *pfVar4,0.0,1.0);
  *(undefined8 *)(__return_storage_ptr__->bbox).max.m_data = local_64.m_data._0_8_;
  *(undefined8 *)((__return_storage_ptr__->bbox).max.m_data + 2) = local_64.m_data._8_8_;
  if (this->m_bboxSize == BBOXSIZE_LARGER) {
    fVar5 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_4>::x(&(__return_storage_ptr__->bbox).min);
    *pfVar4 = *pfVar4 + fVar5 * -0.5;
    fVar5 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_4>::y(&(__return_storage_ptr__->bbox).min);
    *pfVar4 = *pfVar4 + fVar5 * -0.5;
    fVar5 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_4>::z(&(__return_storage_ptr__->bbox).min);
    *pfVar4 = *pfVar4 + fVar5 * -0.5;
    fVar5 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_4>::x(&(__return_storage_ptr__->bbox).max);
    *pfVar4 = fVar5 * 0.5 + *pfVar4;
    fVar5 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_4>::y(&(__return_storage_ptr__->bbox).max);
    *pfVar4 = fVar5 * 0.5 + *pfVar4;
    fVar5 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_4>::z(&(__return_storage_ptr__->bbox).max);
    *pfVar4 = fVar5 * 0.5 + *pfVar4;
  }
  else if (this->m_bboxSize == BBOXSIZE_SMALLER) {
    fVar6 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_2>::x(&__return_storage_ptr__->patternSize);
    fVar5 = *pfVar4;
    pfVar4 = tcu::Vector<float,_4>::x(&(__return_storage_ptr__->bbox).min);
    *pfVar4 = fVar6 * 0.4 * fVar5 + *pfVar4;
    fVar6 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_2>::y(&__return_storage_ptr__->patternSize);
    fVar5 = *pfVar4;
    pfVar4 = tcu::Vector<float,_4>::y(&(__return_storage_ptr__->bbox).min);
    *pfVar4 = fVar6 * 0.4 * fVar5 + *pfVar4;
    fVar6 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_2>::x(&__return_storage_ptr__->patternSize);
    fVar5 = *pfVar4;
    pfVar4 = tcu::Vector<float,_4>::x(&(__return_storage_ptr__->bbox).max);
    *pfVar4 = *pfVar4 - fVar6 * 0.4 * fVar5;
    fVar6 = de::Random::getFloat((Random *)local_38);
    pfVar4 = tcu::Vector<float,_2>::y(&__return_storage_ptr__->patternSize);
    fVar5 = *pfVar4;
    pfVar4 = tcu::Vector<float,_4>::y(&(__return_storage_ptr__->bbox).max);
    *pfVar4 = -(fVar6 * 0.4) * fVar5 + *pfVar4;
  }
  de::Random::~Random((Random *)local_38);
  return __return_storage_ptr__;
}

Assistant:

BBoxRenderCase::IterationConfig BBoxRenderCase::generateRandomConfig (int seed, const tcu::IVec2& renderTargetSize) const
{
	de::Random		rnd		(seed);
	IterationConfig	config;

	// viewport config
	config.viewportSize.x()	= rnd.getInt(MIN_VIEWPORT_SIZE, de::min<int>(renderTargetSize.x(), MAX_VIEWPORT_SIZE));
	config.viewportSize.y()	= rnd.getInt(MIN_VIEWPORT_SIZE, de::min<int>(renderTargetSize.y(), MAX_VIEWPORT_SIZE));
	config.viewportPos.x()	= rnd.getInt(0, renderTargetSize.x() - config.viewportSize.x());
	config.viewportPos.y()	= rnd.getInt(0, renderTargetSize.y() - config.viewportSize.y());

	// pattern location inside viewport
	config.patternSize.x()	= rnd.getFloat(0.4f, 1.4f);
	config.patternSize.y()	= rnd.getFloat(0.4f, 1.4f);
	config.patternPos.x()	= rnd.getFloat(-1.0f, 1.0f - config.patternSize.x());
	config.patternPos.y()	= rnd.getFloat(-1.0f, 1.0f - config.patternSize.y());

	// accurate bounding box
	config.bbox.min			= tcu::Vec4(config.patternPos.x(), config.patternPos.y(), 0.0f, 1.0f);
	config.bbox.max			= tcu::Vec4(config.patternPos.x() + config.patternSize.x(), config.patternPos.y() + config.patternSize.y(), 0.0f, 1.0f);

	if (m_bboxSize == BBOXSIZE_LARGER)
	{
		// increase bbox size
		config.bbox.min.x() -= rnd.getFloat() * 0.5f;
		config.bbox.min.y() -= rnd.getFloat() * 0.5f;
		config.bbox.min.z() -= rnd.getFloat() * 0.5f;

		config.bbox.max.x() += rnd.getFloat() * 0.5f;
		config.bbox.max.y() += rnd.getFloat() * 0.5f;
		config.bbox.max.z() += rnd.getFloat() * 0.5f;
	}
	else if (m_bboxSize == BBOXSIZE_SMALLER)
	{
		// reduce bbox size
		config.bbox.min.x() += rnd.getFloat() * 0.4f * config.patternSize.x();
		config.bbox.min.y() += rnd.getFloat() * 0.4f * config.patternSize.y();

		config.bbox.max.x() -= rnd.getFloat() * 0.4f * config.patternSize.x();
		config.bbox.max.y() -= rnd.getFloat() * 0.4f * config.patternSize.y();
	}

	return config;
}